

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

ssize_t __thiscall SimpleLogger::LogElem::write(LogElem *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  Status val;
  Status exp;
  Status *local_38;
  uint local_4;
  
  local_38 = (Status *)CONCAT44(in_register_00000034,__fd);
  bVar1 = std::atomic<SimpleLogger::LogElem::Status>::compare_exchange_strong
                    ((atomic<SimpleLogger::LogElem::Status> *)this,local_38,
                     (Status)((ulong)__buf >> 0x20),(memory_order)__buf);
  if (bVar1) {
    if ((Status *)0x1000 < local_38) {
      local_38 = (Status *)0x1000;
    }
    this->len = (size_t)local_38;
    memcpy(this->ctx,__buf,this->len);
    std::atomic<SimpleLogger::LogElem::Status>::store(&this->status,DIRTY,memory_order_seq_cst);
    local_4 = 0;
  }
  else {
    local_4 = 0xffffffff;
  }
  return (ulong)local_4;
}

Assistant:

int SimpleLogger::LogElem::write(size_t _len, char* msg) {
    Status exp = CLEAN;
    Status val = WRITING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    len = (_len > MSG_SIZE) ? MSG_SIZE : _len;
    memcpy(ctx, msg, len);

    status.store(LogElem::DIRTY);
    return 0;
}